

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PositionColorShader::shadeVertices
          (PositionColorShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pVVar1 = packets[uVar3];
    rr::readVertexAttribFloat((rr *)&local_48,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
    *(undefined8 *)(pVVar1->position).m_data = local_48;
    *(undefined8 *)((pVVar1->position).m_data + 2) = uStack_40;
    rr::readVertexAttribFloat((rr *)&local_48,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
    *(undefined8 *)&pVVar1->outputs[0].v = local_48;
    *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = uStack_40;
  }
  return;
}

Assistant:

void PositionColorShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const int positionAttrLoc = 0;
		const int colorAttrLoc = 1;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Transform to position
		packet.position = rr::readVertexAttribFloat(inputs[positionAttrLoc], packet.instanceNdx, packet.vertexNdx);

		// Pass color to FS
		packet.outputs[VARYINGLOC_COLOR] = rr::readVertexAttribFloat(inputs[colorAttrLoc], packet.instanceNdx, packet.vertexNdx);
	}
}